

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

void * MemoryEditor::EndianessCopyBigEndian(void *_dst,void *_src,size_t s,int is_little_endian)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  undefined1 *puVar4;
  
  if (is_little_endian != 0) {
    lVar2 = 0;
    iVar3 = 0;
    if (0 < (int)s) {
      iVar3 = (int)s;
    }
    puVar4 = (undefined1 *)(s + (long)_src);
    for (; puVar4 = puVar4 + -1, iVar3 != (int)lVar2; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)_dst + lVar2) = *puVar4;
    }
    return _dst;
  }
  pvVar1 = memcpy(_dst,_src,s);
  return pvVar1;
}

Assistant:

static void* EndianessCopyBigEndian(void* _dst, void* _src, size_t s, int is_little_endian)
    {
        if (is_little_endian)
        {
            uint8_t* dst = (uint8_t*)_dst;
            uint8_t* src = (uint8_t*)_src + s - 1;
            for (int i = 0, n = (int)s; i < n; ++i)
                memcpy(dst++, src--, 1);
            return _dst;
        }
        else
        {
            return memcpy(_dst, _src, s);
        }
    }